

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O0

void genInstruction(int a,int b)

{
  int b_local;
  int a_local;
  
  if (b < 0x10) {
    genByte(a * 0x10 + b);
  }
  else {
    genInstruction(0,a);
    genByte(b);
  }
  return;
}

Assistant:

void genInstruction(int a, int b)
{
    /*printf("gen instruction %d %d\n", a, b); */
    if (b < 16) {
        genByte(a * 16 + b);
    } else {
        genInstruction(0, a);
        genByte(b);
    }
}